

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::setTimeRequestReturnCallback
          (Federate *this,function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *callback)

{
  string_view message;
  Modes MVar1;
  undefined8 uVar2;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffffe8;
  
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x21f736);
  if (MVar1 != PENDING_ITERATIVE_TIME) {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x21f748);
    if (MVar1 != PENDING_TIME) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator=
                (in_RSI,in_stack_ffffffffffffffe8);
      return;
    }
  }
  uVar2 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_RDI);
  message._M_str = (char *)in_RSI;
  message._M_len = (size_t)in_stack_ffffffffffffffe8;
  InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_stack_ffffffffffffffe0,message)
  ;
  __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void Federate::setTimeRequestReturnCallback(std::function<void(Time, bool)> callback)
{
    if (currentMode == Modes::PENDING_ITERATIVE_TIME || currentMode == Modes::PENDING_TIME) {
        throw(InvalidFunctionCall(
            "cannot update time request return callback during an async operation"));  // LCOV_EXCL_LINE
    }
    timeRequestReturnCallback = std::move(callback);
}